

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

mat<double,_3,_3> *
linalg::adjugate<double>(mat<double,_3,_3> *__return_storage_ptr__,mat<double,_3,_3> *a)

{
  double local_a0;
  double local_98;
  double local_90;
  vec<double,_3> local_88;
  double local_70;
  double local_68;
  double local_60;
  vec<double,_3> local_58;
  double local_40;
  double local_38;
  double local_30;
  vec<double,_3> local_28;
  mat<double,_3,_3> *local_10;
  mat<double,_3,_3> *a_local;
  
  local_30 = (a->y).y * (a->z).z + -((a->z).y * (a->y).z);
  local_38 = (a->z).y * (a->x).z + -((a->x).y * (a->z).z);
  local_40 = (a->x).y * (a->y).z + -((a->y).y * (a->x).z);
  local_10 = a;
  vec<double,_3>::vec(&local_28,&local_30,&local_38,&local_40);
  local_60 = (local_10->y).z * (local_10->z).x + -((local_10->z).z * (local_10->y).x);
  local_68 = (local_10->z).z * (local_10->x).x + -((local_10->x).z * (local_10->z).x);
  local_70 = (local_10->x).z * (local_10->y).x + -((local_10->y).z * (local_10->x).x);
  vec<double,_3>::vec(&local_58,&local_60,&local_68,&local_70);
  local_90 = (local_10->y).x * (local_10->z).y + -((local_10->z).x * (local_10->y).y);
  local_98 = (local_10->z).x * (local_10->x).y + -((local_10->x).x * (local_10->z).y);
  local_a0 = (local_10->x).x * (local_10->y).y + -((local_10->y).x * (local_10->x).y);
  vec<double,_3>::vec(&local_88,&local_90,&local_98,&local_a0);
  mat<double,_3,_3>::mat(__return_storage_ptr__,&local_28,&local_58,&local_88);
  return __return_storage_ptr__;
}

Assistant:

constexpr linalg::mat<T,3,3> linalg::adjugate(const mat<T,3,3> & a) 
{
    return {{a.y.y*a.z.z - a.z.y*a.y.z, a.z.y*a.x.z - a.x.y*a.z.z, a.x.y*a.y.z - a.y.y*a.x.z},
            {a.y.z*a.z.x - a.z.z*a.y.x, a.z.z*a.x.x - a.x.z*a.z.x, a.x.z*a.y.x - a.y.z*a.x.x},
            {a.y.x*a.z.y - a.z.x*a.y.y, a.z.x*a.x.y - a.x.x*a.z.y, a.x.x*a.y.y - a.y.x*a.x.y}}; 
}